

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O3

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::call
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,
          string *expression)

{
  if (this->data->_report_exceptions == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os," try { ",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,"static_assert(std::is_same<decltype(",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,(expression->_M_dataplus)._M_p,expression->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,"), void>::value, \"$call{} requires void expression\"); (",0x37)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,(expression->_M_dataplus)._M_p,expression->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,");",2);
  close_exception_handling(this,expression);
  return;
}

Assistant:

void call(const std::string& expression)
    {
    static_assert(std::is_same<decltype(open_exception_handling()), void>::value, "$call{} requires void expression"); (open_exception_handling());
    _serialize.text("static_assert(std::is_same<decltype(");_serialize.raw(expression);_serialize.text("), void>::value, \"$call{} requires void expression\"); (");_serialize.raw(expression);_serialize.text(");");
    static_assert(std::is_same<decltype(close_exception_handling(expression)), void>::value, "$call{} requires void expression"); (close_exception_handling(expression));
    }